

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zel_basic_leak_checker.cpp
# Opt level: O0

void __thiscall validation_layer::basic_leakChecker::~basic_leakChecker(basic_leakChecker *this)

{
  basic_leakChecker *this_local;
  
  if ((this->enablebasic_leak & 1U) != 0) {
    if (basic_leak_checker != (long *)0x0) {
      (**(code **)(*basic_leak_checker + 0xcb8))();
    }
    if (DAT_00322ef8 != (long *)0x0) {
      (**(code **)(*DAT_00322ef8 + 0x458))();
    }
    if (DAT_00322ef0 != (long *)0x0) {
      (**(code **)(*DAT_00322ef0 + 0x958))();
    }
  }
  return;
}

Assistant:

basic_leakChecker::~basic_leakChecker() {
        if(enablebasic_leak) {
            delete basic_leak_checker.zeValidation;
            delete basic_leak_checker.zetValidation;
            delete basic_leak_checker.zesValidation;
        }
    }